

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkDarRetimeStep(Abc_Ntk_t *pNtk,int fVerbose)

{
  int iVar1;
  Aig_Man_t *p;
  Aig_Man_t *pMan;
  Abc_Ntk_t *pNtkAig;
  int fVerbose_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 != 0) {
    p = Abc_NtkToDar(pNtk,0,1);
    if (p == (Aig_Man_t *)0x0) {
      pNtk_local = (Abc_Ntk_t *)0x0;
    }
    else {
      if (p->vFlopNums != (Vec_Int_t *)0x0) {
        Vec_IntFree(p->vFlopNums);
      }
      p->vFlopNums = (Vec_Int_t *)0x0;
      Aig_ManPrintStats(p);
      Saig_ManRetimeSteps(p,1000,1,0);
      Aig_ManPrintStats(p);
      pNtk_local = Abc_NtkFromDarSeqSweep(pNtk,p);
      Aig_ManStop(p);
    }
    return pNtk_local;
  }
  __assert_fail("Abc_NtkIsStrash(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcDar.c"
                ,0xd7d,"Abc_Ntk_t *Abc_NtkDarRetimeStep(Abc_Ntk_t *, int)");
}

Assistant:

Abc_Ntk_t * Abc_NtkDarRetimeStep( Abc_Ntk_t * pNtk, int fVerbose )
{
    Abc_Ntk_t * pNtkAig;
    Aig_Man_t * pMan;
    assert( Abc_NtkIsStrash(pNtk) );
    pMan = Abc_NtkToDar( pNtk, 0, 1 );
    if ( pMan == NULL )
        return NULL;
    if ( pMan->vFlopNums )
        Vec_IntFree( pMan->vFlopNums ); 
    pMan->vFlopNums = NULL;

    Aig_ManPrintStats(pMan);
    Saig_ManRetimeSteps( pMan, 1000, 1, 0 );
    Aig_ManPrintStats(pMan);

    pNtkAig = Abc_NtkFromDarSeqSweep( pNtk, pMan );
    Aig_ManStop( pMan );
    return pNtkAig;
}